

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

bool __thiscall nivalis::Expr::ASTNode::operator==(ASTNode *this,ASTNode *other)

{
  bool bVar1;
  uint32_t *in_RSI;
  uint32_t *in_RDI;
  bool local_1;
  
  if (*in_RSI == *in_RDI) {
    bVar1 = OpCode::has_ref(*in_RDI);
    if ((((bVar1) || (*in_RDI == 1)) || (*in_RDI == 9)) &&
       (*(long *)(in_RDI + 2) != *(long *)(in_RSI + 2))) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Expr::ASTNode::operator==(const ASTNode& other) const {
    if (other.opcode != opcode) return false;
    if ((OpCode::has_ref(opcode) || opcode == OpCode::val ||
            opcode == OpCode::thunk_jmp) &&
        ref != other.ref) return false;
    return true;
}